

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

void __thiscall LexerTest_LexNan_Test::TestBody(LexerTest_LexNan_Test *this)

{
  byte bVar1;
  internal extraout_var;
  internal extraout_var_00;
  internal extraout_var_01;
  internal extraout_var_02;
  internal extraout_var_03;
  ulong uVar2;
  char *in_R9;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  string_view buffer_31;
  string_view buffer_32;
  string_view buffer_33;
  string_view buffer_34;
  string_view buffer_35;
  string_view buffer_36;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_680;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_658;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_630;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_608;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_590;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_540;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  Lexer local_90;
  internal local_38 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_20;
  
  local_680._M_engaged = false;
  buffer._M_str = "nan";
  buffer._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            (&local_90,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_680);
  ::wasm::WATParser::Lexer::takeF32();
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_38[0] = extraout_var;
  ::wasm::WATParser::Lexer::~Lexer(&local_90);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_680);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_90,local_38,(AssertionResult *)"Lexer(\"nan\"sv).takeF32()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2be,(char *)local_90.pos);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    local_658._M_engaged = false;
    buffer_00._M_str = "nan";
    buffer_00._M_len = 3;
    ::wasm::WATParser::Lexer::Lexer
              (&local_90,buffer_00,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_658);
    local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ::wasm::WATParser::Lexer::~Lexer(&local_90);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_658);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_90,local_38,(AssertionResult *)"Lexer(\"nan\"sv).takeF64()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2bf,(char *)local_90.pos);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      local_630._M_engaged = false;
      buffer_01._M_str = "+nan";
      buffer_01._M_len = 4;
      ::wasm::WATParser::Lexer::Lexer
                (&local_90,buffer_01,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_630);
      ::wasm::WATParser::Lexer::takeF32();
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_38[0] = extraout_var_00;
      ::wasm::WATParser::Lexer::~Lexer(&local_90);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_630);
      if (local_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_90,local_38,(AssertionResult *)"Lexer(\"+nan\"sv).takeF32()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2c1,(char *)local_90.pos);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
        local_608._M_engaged = false;
        buffer_02._M_str = "+nan";
        buffer_02._M_len = 4;
        ::wasm::WATParser::Lexer::Lexer
                  (&local_90,buffer_02,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_608);
        local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        ::wasm::WATParser::Lexer::~Lexer(&local_90);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_608);
        if (local_38[0] == (internal)0x0) {
          testing::Message::Message((Message *)&gtest_ar_.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_90,local_38,(AssertionResult *)"Lexer(\"+nan\"sv).takeF64()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_20,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2c2,(char *)local_90.pos);
          testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar_);
          local_5e0._M_engaged = false;
          buffer_03._M_str = "-nan";
          buffer_03._M_len = 4;
          ::wasm::WATParser::Lexer::Lexer
                    (&local_90,buffer_03,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_5e0);
          ::wasm::WATParser::Lexer::takeF32();
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          local_38[0] = extraout_var_01;
          ::wasm::WATParser::Lexer::~Lexer(&local_90);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_5e0);
          if (local_38[0] == (internal)0x0) {
            testing::Message::Message((Message *)&gtest_ar_.message_);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_90,local_38,(AssertionResult *)"Lexer(\"-nan\"sv).takeF32()"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2c4,(char *)local_90.pos);
            testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar_);
            local_5b8._M_engaged = false;
            buffer_04._M_str = "-nan";
            buffer_04._M_len = 4;
            ::wasm::WATParser::Lexer::Lexer
                      (&local_90,buffer_04,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_5b8);
            local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            ::wasm::WATParser::Lexer::~Lexer(&local_90);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset(&local_5b8);
            if (local_38[0] == (internal)0x0) {
              testing::Message::Message((Message *)&gtest_ar_.message_);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_90,local_38,
                         (AssertionResult *)"Lexer(\"-nan\"sv).takeF64()","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_20,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2c5,(char *)local_90.pos);
              testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&gtest_ar_);
              local_590._M_engaged = false;
              buffer_05._M_str = "nan:0x01";
              buffer_05._M_len = 8;
              ::wasm::WATParser::Lexer::Lexer
                        (&local_90,buffer_05,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_590);
              ::wasm::WATParser::Lexer::takeF32();
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              local_38[0] = extraout_var_02;
              ::wasm::WATParser::Lexer::~Lexer(&local_90);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_590);
              if (local_38[0] == (internal)0x0) {
                testing::Message::Message((Message *)&gtest_ar_.message_);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&local_90,local_38,
                           (AssertionResult *)"Lexer(\"nan:0x01\"sv).takeF32()","false","true",in_R9
                          );
                testing::internal::AssertHelper::AssertHelper
                          (&local_20,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x2c7,(char *)local_90.pos);
                testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_)
                ;
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_568._M_engaged = false;
                buffer_06._M_str = "nan:0x01";
                buffer_06._M_len = 8;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_90,buffer_06,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_568);
                local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                ::wasm::WATParser::Lexer::~Lexer(&local_90);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_568);
                if (local_38[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&gtest_ar_.message_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_90,local_38,
                             (AssertionResult *)"Lexer(\"nan:0x01\"sv).takeF64()","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_20,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x2c8,(char *)local_90.pos);
                  testing::internal::AssertHelper::operator=
                            (&local_20,(Message *)&gtest_ar_.message_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&gtest_ar_);
                  local_540._M_engaged = false;
                  buffer_07._M_str = "+nan:0x01";
                  buffer_07._M_len = 9;
                  ::wasm::WATParser::Lexer::Lexer
                            (&local_90,buffer_07,
                             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_540);
                  ::wasm::WATParser::Lexer::takeF32();
                  gtest_ar_.success_ = false;
                  gtest_ar_._1_7_ = 0;
                  local_38[0] = extraout_var_03;
                  ::wasm::WATParser::Lexer::~Lexer(&local_90);
                  std::
                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_M_reset(&local_540);
                  if (local_38[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&gtest_ar_.message_);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&local_90,local_38,
                               (AssertionResult *)"Lexer(\"+nan:0x01\"sv).takeF32()","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_20,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x2ca,(char *)local_90.pos);
                    testing::internal::AssertHelper::operator=
                              (&local_20,(Message *)&gtest_ar_.message_);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&gtest_ar_);
                    local_518._M_engaged = false;
                    buffer_08._M_str = "+nan:0x01";
                    buffer_08._M_len = 9;
                    ::wasm::WATParser::Lexer::Lexer
                              (&local_90,buffer_08,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_518);
                    local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                    gtest_ar_.success_ = false;
                    gtest_ar_._1_7_ = 0;
                    ::wasm::WATParser::Lexer::~Lexer(&local_90);
                    std::
                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_M_reset(&local_518);
                    if (local_38[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&gtest_ar_.message_);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&local_90,local_38,
                                 (AssertionResult *)"Lexer(\"+nan:0x01\"sv).takeF64()","false",
                                 "true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_20,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x2cb,(char *)local_90.pos);
                      testing::internal::AssertHelper::operator=
                                (&local_20,(Message *)&gtest_ar_.message_);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&gtest_ar_);
                      local_4f0._M_engaged = false;
                      buffer_09._M_str = "-nan:0x01";
                      buffer_09._M_len = 9;
                      ::wasm::WATParser::Lexer::Lexer
                                (&local_90,buffer_09,
                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4f0);
                      local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                      gtest_ar_.success_ = false;
                      gtest_ar_._1_7_ = 0;
                      ::wasm::WATParser::Lexer::~Lexer(&local_90);
                      std::
                      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_M_reset(&local_4f0);
                      if (local_38[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&gtest_ar_.message_);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&local_90,local_38,
                                   (AssertionResult *)"Lexer(\"-nan:0x01\"sv).takeF64()","false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_20,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x2cd,(char *)local_90.pos);
                        testing::internal::AssertHelper::operator=
                                  (&local_20,(Message *)&gtest_ar_.message_);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&gtest_ar_);
                        local_4c8._M_engaged = false;
                        buffer_10._M_str = "-nan:0x01";
                        buffer_10._M_len = 9;
                        ::wasm::WATParser::Lexer::Lexer
                                  (&local_90,buffer_10,
                                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_4c8);
                        local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                        gtest_ar_.success_ = false;
                        gtest_ar_._1_7_ = 0;
                        ::wasm::WATParser::Lexer::~Lexer(&local_90);
                        std::
                        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::_M_reset(&local_4c8);
                        if (local_38[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&gtest_ar_.message_);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&local_90,local_38,
                                     (AssertionResult *)"Lexer(\"-nan:0x01\"sv).takeF64()","false",
                                     "true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_20,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x2ce,(char *)local_90.pos);
                          testing::internal::AssertHelper::operator=
                                    (&local_20,(Message *)&gtest_ar_.message_);
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_4a0._M_engaged = false;
                          buffer_11._M_str = "nan:0x1234";
                          buffer_11._M_len = 10;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_90,buffer_11,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_4a0);
                          local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                          gtest_ar_.success_ = false;
                          gtest_ar_._1_7_ = 0;
                          ::wasm::WATParser::Lexer::~Lexer(&local_90);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_4a0);
                          if (local_38[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&gtest_ar_.message_);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&local_90,local_38,
                                       (AssertionResult *)"Lexer(\"nan:0x1234\"sv).takeF64()",
                                       "false","true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_20,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x2d0,(char *)local_90.pos);
                            testing::internal::AssertHelper::operator=
                                      (&local_20,(Message *)&gtest_ar_.message_);
                          }
                          else {
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&gtest_ar_);
                            local_478._M_engaged = false;
                            buffer_12._M_str = "nan:0x1234";
                            buffer_12._M_len = 10;
                            ::wasm::WATParser::Lexer::Lexer
                                      (&local_90,buffer_12,
                                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_478);
                            local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            ::wasm::WATParser::Lexer::~Lexer(&local_90);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset(&local_478);
                            if (local_38[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&gtest_ar_.message_);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&local_90,local_38,
                                         (AssertionResult *)"Lexer(\"nan:0x1234\"sv).takeF64()",
                                         "false","true",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_20,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x2d1,(char *)local_90.pos);
                              testing::internal::AssertHelper::operator=
                                        (&local_20,(Message *)&gtest_ar_.message_);
                            }
                            else {
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_450._M_engaged = false;
                              buffer_13._M_str = "nan:0xf_ffff_ffff_ffff";
                              buffer_13._M_len = 0x16;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_13,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_450);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 >> 0x20 & 1) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_450);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0xf_ffff_ffff_ffff\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d3,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_428._M_engaged = false;
                              buffer_14._M_str = "nan:0xf_ffff_ffff_ffff";
                              buffer_14._M_len = 0x16;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_14,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_428);
                              local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_428);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0xf_ffff_ffff_ffff\"sv).takeF64()","false",
                                           "true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d4,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_400._M_engaged = false;
                              buffer_15._M_str = "nanjunk";
                              buffer_15._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_15,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_400);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_400);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nanjunk\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d6,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_3d8._M_engaged = false;
                              buffer_16._M_str = "nanjunk";
                              buffer_16._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_16,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3d8);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_3d8);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nanjunk\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d7,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_3b0._M_engaged = false;
                              buffer_17._M_str = "nan:";
                              buffer_17._M_len = 4;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_17,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3b0);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_3b0);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d9,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_388._M_engaged = false;
                              buffer_18._M_str = "nan:";
                              buffer_18._M_len = 4;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_18,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_388);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_388);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2da,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_360._M_engaged = false;
                              buffer_19._M_str = "nan:0x";
                              buffer_19._M_len = 6;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_19,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_360);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_360);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x\"sv).takeF32()","true"
                                           ,"false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2dc,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_338._M_engaged = false;
                              buffer_20._M_str = "nan:0x";
                              buffer_20._M_len = 6;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_20,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_338);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_338);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x\"sv).takeF64()","true"
                                           ,"false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2dd,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_310._M_engaged = false;
                              buffer_21._M_str = "nan:0xjunk";
                              buffer_21._M_len = 10;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_21,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_310);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_310);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0xjunk\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2df,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_2e8._M_engaged = false;
                              buffer_22._M_str = "nan:0xjunk";
                              buffer_22._M_len = 10;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_22,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_2e8);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_2e8);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0xjunk\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e0,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_2c0._M_engaged = false;
                              buffer_23._M_str = "nan:-0x1";
                              buffer_23._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_23,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_2c0);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_2c0);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:-0x1\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e2,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_298._M_engaged = false;
                              buffer_24._M_str = "nan:-0x1";
                              buffer_24._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_24,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_298);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_298);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:-0x1\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e3,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_270._M_engaged = false;
                              buffer_25._M_str = "nan:+0x1";
                              buffer_25._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_25,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_270);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_270);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:+0x1\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e5,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_248._M_engaged = false;
                              buffer_26._M_str = "nan:+0x1";
                              buffer_26._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_26,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_248);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_248);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:+0x1\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e6,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_220._M_engaged = false;
                              buffer_27._M_str = "nan:0x0";
                              buffer_27._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_27,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_220);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_220);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x0\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e8,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_1f8._M_engaged = false;
                              buffer_28._M_str = "nan:0x0";
                              buffer_28._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_28,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1f8);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_1f8);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x0\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e9,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_1d0._M_engaged = false;
                              buffer_29._M_str = "nan:0x10_0000_0000_0000";
                              buffer_29._M_len = 0x17;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_29,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1d0);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_1d0);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x10_0000_0000_0000\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2eb,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_1a8._M_engaged = false;
                              buffer_30._M_str = "nan:0x10_0000_0000_0000";
                              buffer_30._M_len = 0x17;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_30,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1a8);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_1a8);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x10_0000_0000_0000\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ec,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_180._M_engaged = false;
                              buffer_31._M_str = "nan:0x1_0000_0000_0000_0000";
                              buffer_31._M_len = 0x1b;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_31,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_180);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_180);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x1_0000_0000_0000_0000\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ee,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_158._M_engaged = false;
                              buffer_32._M_str = "nan:0x1_0000_0000_0000_0000";
                              buffer_32._M_len = 0x1b;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_32,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_158);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_158);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x1_0000_0000_0000_0000\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ef,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_130._M_engaged = false;
                              buffer_33._M_str = "NAN";
                              buffer_33._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_33,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_130);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_130);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NAN\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f1,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_108._M_engaged = false;
                              buffer_34._M_str = "NAN";
                              buffer_34._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_34,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_108);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar1 & 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_108);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NAN\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f2,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_e0._M_engaged = false;
                              buffer_35._M_str = "NaN";
                              buffer_35._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_35,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_e0);
                              uVar2 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_e0);
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NaN\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f4,(char *)local_90.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&local_90);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_b8._M_engaged = false;
                              buffer_36._M_str = "NaN";
                              buffer_36._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_90,buffer_36,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_b8);
                              bVar1 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(bVar1 & 1 ^ 1);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_90);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_b8);
                              if ((bVar1 & 1) == 0) goto LAB_0021b6ed;
                              testing::Message::Message((Message *)&gtest_ar_.message_);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&local_90,local_38,
                                         (AssertionResult *)"Lexer(\"NaN\"sv).takeF64()","true",
                                         "false",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_20,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x2f5,(char *)local_90.pos);
                              testing::internal::AssertHelper::operator=
                                        (&local_20,(Message *)&gtest_ar_.message_);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  std::__cxx11::string::~string((string *)&local_90);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0021b6ed:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  return;
}

Assistant:

TEST(LexerTest, LexNan) {
  ASSERT_TRUE(Lexer("nan"sv).takeF32());
  ASSERT_TRUE(Lexer("nan"sv).takeF64());

  ASSERT_TRUE(Lexer("+nan"sv).takeF32());
  ASSERT_TRUE(Lexer("+nan"sv).takeF64());

  ASSERT_TRUE(Lexer("-nan"sv).takeF32());
  ASSERT_TRUE(Lexer("-nan"sv).takeF64());

  ASSERT_TRUE(Lexer("nan:0x01"sv).takeF32());
  ASSERT_TRUE(Lexer("nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("+nan:0x01"sv).takeF32());
  ASSERT_TRUE(Lexer("+nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("-nan:0x01"sv).takeF64());
  ASSERT_TRUE(Lexer("-nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("nan:0x1234"sv).takeF64());
  ASSERT_TRUE(Lexer("nan:0x1234"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0xf_ffff_ffff_ffff"sv).takeF32());
  EXPECT_TRUE(Lexer("nan:0xf_ffff_ffff_ffff"sv).takeF64());

  EXPECT_FALSE(Lexer("nanjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("nanjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0xjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0xjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:-0x1"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:-0x1"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:+0x1"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:+0x1"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x0"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x0"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x10_0000_0000_0000"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x10_0000_0000_0000"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x1_0000_0000_0000_0000"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x1_0000_0000_0000_0000"sv).takeF64());

  EXPECT_FALSE(Lexer("NAN"sv).takeF32());
  EXPECT_FALSE(Lexer("NAN"sv).takeF64());

  EXPECT_FALSE(Lexer("NaN"sv).takeF32());
  EXPECT_FALSE(Lexer("NaN"sv).takeF64());
}